

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O0

void Ssw_SatStop(Ssw_Sat_t *p)

{
  Ssw_Sat_t *p_local;
  
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  Vec_IntFree(p->vSatVars);
  Vec_PtrFree(p->vFanins);
  Vec_PtrFree(p->vUsedPis);
  if (p != (Ssw_Sat_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Ssw_SatStop( Ssw_Sat_t * p )
{
//    Abc_Print( 1, "Recycling SAT solver with %d vars and %d restarts.\n", 
//        p->pSat->size, p->pSat->stats.starts );
    if ( p->pSat )
        sat_solver_delete( p->pSat );
    Vec_IntFree( p->vSatVars );
    Vec_PtrFree( p->vFanins );
    Vec_PtrFree( p->vUsedPis );
    ABC_FREE( p );
}